

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  long lVar1;
  undefined8 *puVar2;
  _List_node_base *p_Var3;
  iterator __position;
  cmExpandedCommandArgument *argument;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  int iVar7;
  _Self __tmp;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  string local_b8;
  undefined1 local_98;
  _List_node_base *local_90;
  cmConditionEvaluator *local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  string *local_60;
  MessageType *local_58;
  cmExpandedCommandArgument *local_50;
  undefined8 local_48;
  long lStack_40;
  undefined8 local_38;
  
  p_Var8 = (newArgs->
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_88 = this;
  local_60 = errorString;
  local_58 = status;
  do {
    if (p_Var8 == (_List_node_base *)newArgs) {
      return true;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"(","");
    argument = (cmExpandedCommandArgument *)((long)p_Var8 + 0x10);
    bVar4 = IsKeyword(local_88,&local_b8,argument);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      p_Var9 = p_Var8->_M_next;
      local_90 = p_Var8;
      local_50 = argument;
      if (p_Var9 == (_List_node_base *)newArgs) {
LAB_00266291:
        std::__cxx11::string::_M_replace
                  ((ulong)local_60,0,(char *)local_60->_M_string_length,0x4ecfaa);
        *local_58 = FATAL_ERROR;
        return false;
      }
      iVar7 = 1;
      do {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"(","");
        bVar4 = IsKeyword(local_88,&local_b8,(cmExpandedCommandArgument *)(p_Var9 + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,")","");
        bVar5 = IsKeyword(local_88,&local_b8,(cmExpandedCommandArgument *)(p_Var9 + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        iVar7 = (iVar7 + (uint)bVar4) - (uint)bVar5;
        p_Var9 = p_Var9->_M_next;
      } while ((p_Var9 != (_List_node_base *)newArgs) && (iVar7 != 0));
      if (iVar7 != 0) goto LAB_00266291;
      local_48 = 0;
      lStack_40 = 0;
      local_38 = 0;
      std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
      _M_range_insert<std::_List_iterator<cmExpandedCommandArgument>>
                ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                 &local_48,0,
                 (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    *)&local_90->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,p_Var9);
      lVar1 = lStack_40 + -0x28;
      puVar2 = (undefined8 *)(lStack_40 + -0x28);
      plVar6 = (long *)(lStack_40 + -0x18);
      lStack_40 = lVar1;
      if ((long *)*puVar2 != plVar6) {
        operator_delete((long *)*puVar2,*plVar6 + 1);
      }
      bVar4 = IsTrue(local_88,(vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               *)&local_48,local_60,local_58);
      local_80 = local_70;
      if (bVar4) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"1","");
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_80,local_78 + (long)local_80);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"0","");
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_80,local_78 + (long)local_80);
      }
      local_98 = 1;
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_b8);
      *(undefined1 *)
       &(((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
         &local_90[3]._M_next)->_M_impl)._M_node.super__List_node_base._M_next = local_98;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      p_Var8 = local_90;
      __position._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &local_90->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      while (__position._M_node != p_Var9) {
        p_Var3 = (__position._M_node)->_M_next;
        std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        _M_erase(newArgs,__position);
        __position._M_node = p_Var3;
      }
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                 &local_48);
    }
    p_Var8 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end())
      {
      if (IsKeyword("(", *arg))
        {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth)
          {
          if (this->IsKeyword("(", *argClose))
            {
              depth++;
            }
          if (this->IsKeyword(")", *argClose))
            {
              depth--;
            }
          argClose++;
          }
        if (depth)
          {
          errorString = "mismatched parenthesis in condition";
          status = cmake::FATAL_ERROR;
          return false;
          }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value =
          this->IsTrue(newArgs2, errorString, status);
        if(value)
          {
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1,argClose);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}